

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall
Catch::AssertionStats::AssertionStats
          (AssertionStats *this,AssertionResult *_assertionResult,
          vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *_infoMessages,
          Totals *_totals)

{
  OfType OVar1;
  pointer pcVar2;
  char *pcVar3;
  size_type sVar4;
  char *pcVar5;
  size_t sVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  uint64_t uVar15;
  uint64_t uVar16;
  uint64_t uVar17;
  uint64_t uVar18;
  uint64_t uVar19;
  uint64_t uVar20;
  uint64_t uVar21;
  size_type sVar22;
  bool bVar23;
  undefined7 uVar24;
  Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *pSVar25;
  size_t sVar26;
  long *local_a8 [2];
  long local_98 [2];
  ReusableStringStream local_88;
  undefined1 local_78 [16];
  _Alloc_hider local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  char *local_48;
  size_t local_40;
  OfType local_38;
  uint local_34;
  
  uVar7 = *(undefined4 *)&(_assertionResult->m_info).field_0x34;
  (this->assertionResult).m_info.resultDisposition = (_assertionResult->m_info).resultDisposition;
  *(undefined4 *)&(this->assertionResult).m_info.field_0x34 = uVar7;
  uVar7 = *(undefined4 *)&(_assertionResult->m_info).macroName.m_start;
  uVar8 = *(undefined4 *)((long)&(_assertionResult->m_info).macroName.m_start + 4);
  sVar4 = (_assertionResult->m_info).macroName.m_size;
  uVar9 = *(undefined4 *)((long)&(_assertionResult->m_info).macroName.m_size + 4);
  uVar10 = *(undefined4 *)&(_assertionResult->m_info).lineInfo.file;
  uVar11 = *(undefined4 *)((long)&(_assertionResult->m_info).lineInfo.file + 4);
  sVar6 = (_assertionResult->m_info).lineInfo.line;
  uVar12 = *(undefined4 *)((long)&(_assertionResult->m_info).lineInfo.line + 4);
  uVar13 = *(undefined4 *)((long)&(_assertionResult->m_info).capturedExpression.m_start + 4);
  sVar22 = (_assertionResult->m_info).capturedExpression.m_size;
  uVar14 = *(undefined4 *)((long)&(_assertionResult->m_info).capturedExpression.m_size + 4);
  *(undefined4 *)&(this->assertionResult).m_info.capturedExpression.m_start =
       *(undefined4 *)&(_assertionResult->m_info).capturedExpression.m_start;
  *(undefined4 *)((long)&(this->assertionResult).m_info.capturedExpression.m_start + 4) = uVar13;
  *(int *)&(this->assertionResult).m_info.capturedExpression.m_size = (int)sVar22;
  *(undefined4 *)((long)&(this->assertionResult).m_info.capturedExpression.m_size + 4) = uVar14;
  *(undefined4 *)&(this->assertionResult).m_info.lineInfo.file = uVar10;
  *(undefined4 *)((long)&(this->assertionResult).m_info.lineInfo.file + 4) = uVar11;
  *(int *)&(this->assertionResult).m_info.lineInfo.line = (int)sVar6;
  *(undefined4 *)((long)&(this->assertionResult).m_info.lineInfo.line + 4) = uVar12;
  *(undefined4 *)&(this->assertionResult).m_info.macroName.m_start = uVar7;
  *(undefined4 *)((long)&(this->assertionResult).m_info.macroName.m_start + 4) = uVar8;
  *(int *)&(this->assertionResult).m_info.macroName.m_size = (int)sVar4;
  *(undefined4 *)((long)&(this->assertionResult).m_info.macroName.m_size + 4) = uVar9;
  (this->assertionResult).m_resultData.message._M_dataplus._M_p =
       (pointer)&(this->assertionResult).m_resultData.message.field_2;
  pcVar2 = (_assertionResult->m_resultData).message._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->assertionResult).m_resultData,pcVar2,
             pcVar2 + (_assertionResult->m_resultData).message._M_string_length);
  (this->assertionResult).m_resultData.reconstructedExpression._M_dataplus._M_p =
       (pointer)&(this->assertionResult).m_resultData.reconstructedExpression.field_2;
  pcVar2 = (_assertionResult->m_resultData).reconstructedExpression._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->assertionResult).m_resultData.reconstructedExpression,pcVar2,
             pcVar2 + (_assertionResult->m_resultData).reconstructedExpression._M_string_length);
  (this->assertionResult).m_resultData.resultType = (_assertionResult->m_resultData).resultType;
  bVar23 = (_assertionResult->m_resultData).lazyExpression.m_isNegated;
  uVar24 = *(undefined7 *)&(_assertionResult->m_resultData).lazyExpression.field_0x9;
  (this->assertionResult).m_resultData.lazyExpression.m_transientExpression =
       (_assertionResult->m_resultData).lazyExpression.m_transientExpression;
  (this->assertionResult).m_resultData.lazyExpression.m_isNegated = bVar23;
  *(undefined7 *)&(this->assertionResult).m_resultData.lazyExpression.field_0x9 = uVar24;
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector
            (&this->infoMessages,_infoMessages);
  uVar15 = (_totals->assertions).passed;
  uVar16 = (_totals->assertions).failed;
  uVar17 = (_totals->assertions).failedButOk;
  uVar18 = (_totals->assertions).skipped;
  uVar19 = (_totals->testCases).passed;
  uVar20 = (_totals->testCases).failed;
  uVar21 = (_totals->testCases).skipped;
  (this->totals).testCases.failedButOk = (_totals->testCases).failedButOk;
  (this->totals).testCases.skipped = uVar21;
  (this->totals).testCases.passed = uVar19;
  (this->totals).testCases.failed = uVar20;
  (this->totals).assertions.failedButOk = uVar17;
  (this->totals).assertions.skipped = uVar18;
  (this->totals).assertions.passed = uVar15;
  (this->totals).assertions.failed = uVar16;
  if ((this->assertionResult).m_resultData.message._M_string_length != 0) {
    pcVar3 = (this->assertionResult).m_info.macroName.m_start;
    sVar4 = (this->assertionResult).m_info.macroName.m_size;
    pcVar5 = (this->assertionResult).m_info.lineInfo.file;
    sVar6 = (this->assertionResult).m_info.lineInfo.line;
    OVar1 = (this->assertionResult).m_resultData.resultType;
    pSVar25 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::
              getInternal();
    sVar26 = StringStreams::add(&pSVar25->super_StringStreams);
    local_88.m_index = sVar26;
    pSVar25 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::
              getInternal();
    local_88.m_oss =
         (ostream *)
         (pSVar25->super_StringStreams).m_streams.
         super__Vector_base<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[sVar26].m_ptr;
    local_60 = 0;
    local_58._M_local_buf[0] = '\0';
    MessageInfo::globalCount = MessageInfo::globalCount + 1;
    pcVar2 = (this->assertionResult).m_resultData.message._M_dataplus._M_p;
    local_a8[0] = local_98;
    local_78._0_8_ = pcVar3;
    local_78._8_8_ = sVar4;
    local_68._M_p = (pointer)&local_58;
    local_48 = pcVar5;
    local_40 = sVar6;
    local_38 = OVar1;
    local_34 = MessageInfo::globalCount;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a8,pcVar2,
               pcVar2 + (this->assertionResult).m_resultData.message._M_string_length);
    std::__cxx11::string::operator=((string *)&local_68,(string *)local_a8);
    if (local_a8[0] != local_98) {
      operator_delete(local_a8[0],local_98[0] + 1);
    }
    std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::
    emplace_back<Catch::MessageInfo>(&this->infoMessages,(MessageInfo *)local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_p != &local_58) {
      operator_delete(local_68._M_p,
                      CONCAT71(local_58._M_allocated_capacity._1_7_,local_58._M_local_buf[0]) + 1);
    }
    ReusableStringStream::~ReusableStringStream(&local_88);
  }
  return;
}

Assistant:

AssertionStats::AssertionStats( AssertionResult const& _assertionResult,
                                    std::vector<MessageInfo> const& _infoMessages,
                                    Totals const& _totals )
    :   assertionResult( _assertionResult ),
        infoMessages( _infoMessages ),
        totals( _totals )
    {
        if( assertionResult.hasMessage() ) {
            // Copy message into messages list.
            // !TBD This should have been done earlier, somewhere
            MessageBuilder builder( assertionResult.getTestMacroName(), assertionResult.getSourceInfo(), assertionResult.getResultType() );
            builder.m_info.message = static_cast<std::string>(assertionResult.getMessage());

            infoMessages.push_back( CATCH_MOVE(builder.m_info) );
        }
    }